

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::testRasterSamplesConsistency
          (TestStatus *__return_storage_ptr__,Context *context,GeometryType geometryType)

{
  VkSampleCountFlagBits rasterizationSamples;
  bool bVar1;
  deUint32 dVar2;
  InstanceInterface *instanceInterface;
  VkPhysicalDevice physicalDevice;
  ostream *poVar3;
  long lVar4;
  NotSupportedError *this;
  uint uVar5;
  deUint32 dVar6;
  int local_54c;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  VkPipelineMultisampleStateCreateInfo local_510;
  string local_4e0;
  ostringstream message;
  ChannelType CStack_4bc;
  Vertex4RGBA local_348;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [8];
  MultisampleRenderer renderer;
  
  local_348.position.m_data[0] = -0.75;
  local_348.position.m_data[1] = 0.0;
  local_348.position.m_data[2] = 0.0;
  local_348.position.m_data[3] = 1.0;
  local_348.color.m_data[0] = 1.0;
  local_348.color.m_data[1] = 0.0;
  local_348.color.m_data[2] = 0.0;
  local_348.color.m_data[3] = 1.0;
  local_328 = 0x3e0000003f400000;
  uStack_320 = 0x3f80000000000000;
  local_318 = 0x3f800000;
  uStack_310 = 0x3f80000000000000;
  local_308 = 0xbe0000003f400000;
  uStack_300 = 0x3f80000000000000;
  local_2f8 = 0x3f800000;
  uStack_2f0 = 0x3f80000000000000;
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,&local_348,(Vertex4RGBA *)local_2e8,(allocator_type *)&renderer);
  local_54c = 0;
  uVar5 = 2;
  for (lVar4 = 1; lVar4 != 7; lVar4 = lVar4 + 1) {
    instanceInterface = Context::getInstanceInterface(context);
    physicalDevice = Context::getPhysicalDevice(context);
    rasterizationSamples = (&DAT_00958910)[lVar4];
    bVar1 = isSupportedSampleCount(instanceInterface,physicalDevice,rasterizationSamples);
    if (bVar1) {
      local_510.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
      local_510.pNext = (void *)0x0;
      local_510.flags = 0;
      local_510.sampleShadingEnable = 0;
      local_510.minSampleShading = 0.0;
      local_510.pSampleMask = (VkSampleMask *)0x0;
      local_510.alphaToCoverageEnable = 0;
      local_510.alphaToOneEnable = 0;
      _message = 0x20;
      CStack_4bc = UNSIGNED_INT24;
      local_510.rasterizationSamples = rasterizationSamples;
      MultisampleRenderer::MultisampleRenderer
                (&renderer,context,VK_FORMAT_R8G8B8A8_UNORM,(IVec2 *)&message,
                 VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,&vertices,&local_510,
                 (VkPipelineColorBlendAttachmentState *)&DAT_00944010);
      MultisampleRenderer::render(&result,&renderer);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&message,
                 result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                 m_data.ptr);
      dVar2 = getUniqueColorsCount((ConstPixelBufferAccess *)&message);
      dVar6 = dVar2;
      if (dVar2 < uVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
        poVar3 = std::operator<<((ostream *)&message,"More unique colors generated with ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(&UNK_0095890c + lVar4 * 4));
        poVar3 = std::operator<<(poVar3," than with ");
        std::ostream::operator<<(poVar3,rasterizationSamples);
        std::__cxx11::stringbuf::str();
        tcu::TestStatus::fail(__return_storage_ptr__,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
        dVar6 = uVar5;
      }
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
      ~UniqueBase(&result.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
      MultisampleRenderer::~MultisampleRenderer(&renderer);
      if (dVar2 < uVar5) goto LAB_004ec707;
      local_54c = local_54c + 1;
      uVar5 = dVar6;
    }
  }
  if (local_54c == 0) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderer,"Multisampling is unsupported",(allocator<char> *)&message);
    tcu::NotSupportedError::NotSupportedError(this,(string *)&renderer);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&renderer,"Number of unique colors increases as the sample count increases",
             (allocator<char> *)&message);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&renderer);
  std::__cxx11::string::~string((string *)&renderer);
LAB_004ec707:
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               );
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testRasterSamplesConsistency (Context& context, GeometryType geometryType)
{
	// Use triangle only.
	DE_UNREF(geometryType);

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_1_BIT,
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	const Vertex4RGBA vertexData[3] =
	{
		{
			tcu::Vec4(-0.75f, 0.0f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		},
		{
			tcu::Vec4(0.75f, 0.125f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		},
		{
			tcu::Vec4(0.75f, -0.125f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		}
	};

	const std::vector<Vertex4RGBA>	vertices			(vertexData, vertexData + 3);
	deUint32						prevUniqueColors	= 2;
	int								renderCount			= 0;

	// Do not render with 1 sample (start with samplesNdx = 1).
	for (int samplesNdx = 1; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		if (!isSupportedSampleCount(context.getInstanceInterface(), context.getPhysicalDevice(), samples[samplesNdx]))
			continue;

		const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			0u,															// VkPipelineMultisampleStateCreateFlags	flags;
			samples[samplesNdx],										// VkSampleCountFlagBits					rasterizationSamples;
			false,														// VkBool32									sampleShadingEnable;
			0.0f,														// float									minSampleShading;
			DE_NULL,													// const VkSampleMask*						pSampleMask;
			false,														// VkBool32									alphaToCoverageEnable;
			false														// VkBool32									alphaToOneEnable;
		};

		MultisampleRenderer				renderer		(context, VK_FORMAT_R8G8B8A8_UNORM, tcu::IVec2(32, 32), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, vertices, multisampleStateParams, getDefaultColorBlendAttachmentState());
		de::MovePtr<tcu::TextureLevel>	result			= renderer.render();
		const deUint32					uniqueColors	= getUniqueColorsCount(result->getAccess());

		renderCount++;

		if (prevUniqueColors > uniqueColors)
		{
			std::ostringstream message;

			message << "More unique colors generated with " << samples[samplesNdx - 1] << " than with " << samples[samplesNdx];
			return tcu::TestStatus::fail(message.str());
		}

		prevUniqueColors = uniqueColors;
	}

	if (renderCount == 0)
		throw tcu::NotSupportedError("Multisampling is unsupported");

	return tcu::TestStatus::pass("Number of unique colors increases as the sample count increases");
}